

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbaInterfaceExamples.cpp
# Opt level: O0

void writeRgba3(char *fileName,Rgba *pixels,int width,int height,char *comments,
               M44f *cameraTransform)

{
  int iVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  ulong in_RSI;
  char *in_RDI;
  RgbaOutputFile file;
  Header header;
  Rgba local_128;
  allocator<char> *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  allocator<char> local_b1;
  string local_b0 [32];
  string local_90 [40];
  Vec2<float> local_68;
  Header local_60 [80];
  ulong local_10;
  char *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  Imath_3_2::Vec2<float>::Vec2(&local_68,0.0,0.0);
  Imf_3_2::Header::Header((Header *)0x3f800000,local_60,in_EDX,in_ECX,&local_68,0,3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  Imf_3_2::TypedAttribute<std::__cxx11::string>::TypedAttribute(local_90);
  Imf_3_2::Header::insert((char *)local_60,(Attribute *)"comments");
  Imf_3_2::TypedAttribute<std::__cxx11::string>::~TypedAttribute
            ((TypedAttribute<std::__cxx11::string> *)local_90);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  Imf_3_2::TypedAttribute<Imath_3_2::Matrix44<float>>::TypedAttribute
            ((Matrix44 *)&stack0xfffffffffffffef0);
  Imf_3_2::Header::insert((char *)local_60,(Attribute *)"cameraTransform");
  Imf_3_2::TypedAttribute<Imath_3_2::Matrix44<float>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Matrix44<float>> *)&stack0xfffffffffffffef0);
  iVar1 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaOutputFile::RgbaOutputFile
            ((RgbaOutputFile *)&local_128,local_8,local_60,WRITE_RGBA,iVar1);
  Imf_3_2::RgbaOutputFile::setFrameBuffer(&local_128,local_10,1);
  Imf_3_2::RgbaOutputFile::writePixels((int)&local_128);
  Imf_3_2::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)&local_128);
  Imf_3_2::Header::~Header(local_60);
  return;
}

Assistant:

void
writeRgba3 (
    const char  fileName[],
    const Rgba* pixels,
    int         width,
    int         height,
    const char  comments[],
    const M44f& cameraTransform)
{
    //
    // Write an RGBA image using class RgbaOutputFile.
    // Store two extra attributes in the image header:
    // a string and a 4x4 transformation matrix.
    //
    //	- open the file
    //	- describe the memory layout of the pixels
    //	- store the pixels in the file
    //

    Header header (width, height);
    header.insert ("comments", StringAttribute (comments));
    header.insert ("cameraTransform", M44fAttribute (cameraTransform));

    RgbaOutputFile file (fileName, header, WRITE_RGBA);
    file.setFrameBuffer (pixels, 1, width);
    file.writePixels (height);
}